

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# spxboundflippingrt.hpp
# Opt level: O3

void __thiscall
soplex::SPxBoundFlippingRT<double>::collectBreakpointsMax
          (SPxBoundFlippingRT<double> *this,int *nBp,int *minIdx,int *idx,int nnz,double *upd,
          double *vec,double *upp,double *low,BreakpointSource src)

{
  Array<soplex::SPxBoundFlippingRT<double>::Breakpoint> *this_00;
  int *piVar1;
  double dVar2;
  double dVar3;
  int iVar4;
  pointer pBVar5;
  double *pdVar6;
  int iVar7;
  ulong uVar8;
  double dVar9;
  double local_80;
  
  if (*nBp == 0) {
    ::soplex::infinity::__tls_init();
    pBVar5 = (pointer)__tls_get_addr(&PTR_003b4b70);
  }
  else {
    pBVar5 = (this->breakpoints).data.
             super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
             ._M_impl.super__Vector_impl_data._M_start + *minIdx;
  }
  if (0 < nnz) {
    piVar1 = idx + nnz;
    local_80 = pBVar5->val;
    pdVar6 = (double *)__tls_get_addr(&PTR_003b4b70);
    dVar2 = *pdVar6;
    this_00 = &this->breakpoints;
    do {
      iVar4 = *idx;
      dVar3 = upd[iVar4];
      dVar9 = (this->super_SPxFastRT<double>).epsilon;
      if (dVar3 <= dVar9) {
        if (-dVar9 <= dVar3) {
          iVar7 = *nBp;
          pBVar5 = (this_00->data).
                   super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
        }
        else {
          dVar9 = low[iVar4];
          ::soplex::infinity::__tls_init();
          iVar7 = *nBp;
          pBVar5 = (this_00->data).
                   super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          if (-dVar2 < dVar9) {
            dVar9 = (this->super_SPxFastRT<double>).fastDelta;
            uVar8 = -(ulong)(low[iVar4] - vec[iVar4] < 0.0);
            dVar9 = (double)(~uVar8 & (ulong)-dVar9 |
                            (ulong)((low[iVar4] - vec[iVar4]) - dVar9) & uVar8);
            goto LAB_0023c6ab;
          }
        }
      }
      else {
        dVar9 = upp[iVar4];
        ::soplex::infinity::__tls_init();
        iVar7 = *nBp;
        pBVar5 = (this_00->data).
                 super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        if (dVar9 < dVar2) {
          dVar9 = (this->super_SPxFastRT<double>).fastDelta;
          uVar8 = -(ulong)(0.0 < upp[iVar4] - vec[iVar4]);
          dVar9 = (double)(~uVar8 & (ulong)dVar9 |
                          (ulong)((upp[iVar4] - vec[iVar4]) + dVar9) & uVar8);
LAB_0023c6ab:
          dVar9 = dVar9 / dVar3;
          pBVar5[iVar7].idx = iVar4;
          iVar7 = *nBp;
          pBVar5[iVar7].src = src;
          pBVar5[iVar7].val = dVar9;
          if (dVar9 < local_80) {
            *minIdx = iVar7;
            iVar7 = *nBp;
            local_80 = dVar9;
          }
          iVar7 = iVar7 + 1;
          *nBp = iVar7;
        }
      }
      if ((int)((ulong)((long)(this->breakpoints).data.
                              super__Vector_base<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
                              ._M_impl.super__Vector_impl_data._M_finish - (long)pBVar5) >> 4) <=
          iVar7) {
        std::
        vector<soplex::SPxBoundFlippingRT<double>::Breakpoint,_std::allocator<soplex::SPxBoundFlippingRT<double>::Breakpoint>_>
        ::resize(&this_00->data,(long)(iVar7 * 2));
      }
      idx = idx + 1;
    } while (idx < piVar1);
  }
  return;
}

Assistant:

void SPxBoundFlippingRT<R>::collectBreakpointsMax(
   int&                  nBp,                /**< number of found breakpoints so far */
   int&                  minIdx,             /**< index to current minimal breakpoint */
   const int*            idx,                /**< pointer to indices of current VectorBase<R> */
   int                   nnz,                /**< number of nonzeros in current VectorBase<R> */
   const R*           upd,                /**< pointer to update values of current VectorBase<R> */
   const R*           vec,                /**< pointer to values of current VectorBase<R> */
   const R*           upp,                /**< pointer to upper bound/rhs of current VectorBase<R> */
   const R*           low,                /**< pointer to lower bound/lhs of current VectorBase<R> */
   BreakpointSource      src                 /**< type of VectorBase<R> (pVec, coPvec or fVec)*/
)
{
   R minVal;
   R curVal;
   const int* last;

   minVal = (nBp == 0) ? R(infinity) : breakpoints[minIdx].val;

   last = idx + nnz;

   for(; idx < last; ++idx)
   {
      int i = *idx;
      R x = upd[i];

      if(x > this->epsilonZero())
      {
         if(upp[i] < R(infinity))
         {
            R y = upp[i] - vec[i];
            curVal = (y <= 0) ? this->fastDelta / x : (y + this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }
      else if(x < -this->epsilonZero())
      {
         if(low[i] > R(-infinity))
         {
            R y = low[i] - vec[i];
            curVal = (y >= 0) ? -this->fastDelta / x : (y - this->fastDelta) / x;
            assert(curVal > 0);

            breakpoints[nBp].idx = i;
            breakpoints[nBp].src = src;
            breakpoints[nBp].val = curVal;

            if(curVal < minVal)
            {
               minVal = curVal;
               minIdx = nBp;
            }

            nBp++;
         }
      }

      if(nBp >= breakpoints.size())
         breakpoints.reSize(nBp * 2);
   }

   return;
}